

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall IntrusiveListTest_clear_Test::TestBody(IntrusiveListTest_clear_Test *this)

{
  TestObject *pTVar1;
  TestObject *pTVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  vector<int,_std::allocator<int>_> *data_values;
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> __ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  TestObjectList list;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  GTestFlagSaver *local_78;
  AssertHelper local_70;
  undefined1 local_68 [8];
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> _Stack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  AssertHelper local_40;
  TestObjectList local_38;
  
  local_58._M_allocated_capacity = 0;
  local_68 = (undefined1  [8])0x0;
  _Stack_60._M_head_impl = (GTestFlagSaver *)0x0;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)operator_new(0x10);
  _Stack_60._M_head_impl = (GTestFlagSaver *)(&paVar3->_M_allocated_capacity + 2);
  paVar3->_M_allocated_capacity = (size_type)&DAT_200000001;
  (&paVar3->_M_allocated_capacity)[1] = 0x400000003;
  local_68 = (undefined1  [8])paVar3;
  local_58._M_allocated_capacity = (size_type)_Stack_60._M_head_impl;
  anon_unknown.dwarf_80ed5::IntrusiveListTest::NewList
            (&local_38,(IntrusiveListTest *)local_68,data_values);
  operator_delete(paVar3,0x10);
  local_80._M_head_impl._0_1_ = local_38.size_ != 0;
  local_78 = (GTestFlagSaver *)0x0;
  if (local_38.size_ == 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)&local_80,(AssertionResult *)"list.empty()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-intrusive-list.cc"
               ,0x1ef,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_68 != (undefined1  [8])&local_58) {
      operator_delete((void *)local_68,(ulong)(local_58._M_allocated_capacity + 1));
    }
    if ((long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) + 8))();
    }
LAB_00154d30:
    pTVar1 = local_38.first_;
    if (local_78 == (GTestFlagSaver *)0x0) goto joined_r0x00154dc1;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_78;
    __ptr._M_head_impl = local_78;
  }
  else {
    while (local_38.first_ != (TestObject *)0x0) {
      if ((local_38.first_)->moved == false) {
        (anonymous_namespace)::TestObject::creation_count =
             (anonymous_namespace)::TestObject::creation_count + -1;
      }
      pTVar1 = ((local_38.first_)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).
               next_;
      operator_delete(local_38.first_,0x20);
      local_38.first_ = pTVar1;
    }
    local_38.first_ = (TestObject *)0x0;
    local_38.last_ = (TestObject *)0x0;
    local_38.size_ = 0;
    local_70.data_._0_4_ = 0;
    local_80._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_68,"0U","list.size()",(uint *)&local_70,(unsigned_long *)&local_80)
    ;
    if (local_68[0] != (internal)0x0) {
      if (_Stack_60._M_head_impl != (GTestFlagSaver *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&_Stack_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Stack_60._M_head_impl);
      }
      local_80._M_head_impl._0_1_ = 1;
      local_78 = (GTestFlagSaver *)0x0;
      goto LAB_00154d30;
    }
    testing::Message::Message((Message *)&local_80);
    if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
         )_Stack_60._M_head_impl ==
        (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)_Stack_60._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-intrusive-list.cc"
               ,499,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
    pTVar1 = local_38.first_;
    if (_Stack_60._M_head_impl == (GTestFlagSaver *)0x0) goto joined_r0x00154dc1;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&_Stack_60;
    __ptr._M_head_impl = _Stack_60._M_head_impl;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr._M_head_impl);
  pTVar1 = local_38.first_;
joined_r0x00154dc1:
  while (pTVar1 != (TestObject *)0x0) {
    if (pTVar1->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar2 = (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar1,0x20);
    pTVar1 = pTVar2;
  }
  return;
}

Assistant:

TEST_F(IntrusiveListTest, clear) {
  TestObjectList list = NewList({1, 2, 3, 4});

  ASSERT_FALSE(list.empty());

  list.clear();

  ASSERT_EQ(0U, list.size());
  ASSERT_TRUE(list.empty());
}